

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

bool __thiscall kj::HttpHeaders::tryParse(HttpHeaders *this,ArrayPtr<char> content)

{
  byte *pbVar1;
  char cVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *unaff_R12;
  size_t unaff_R13;
  StringPtr value;
  StringPtr name;
  char *pcStack_38;
  
  uVar6 = content.size_;
  pcStack_38 = content.ptr;
  if ((uVar6 < 2) || (pcStack_38[uVar6 - 1] != '\n')) {
    pcVar7 = (char *)0x0;
  }
  else {
    lVar3 = uVar6 - 1;
    if (pcStack_38[uVar6 - 2] == '\r') {
      lVar3 = uVar6 - 2;
    }
    pcVar7 = pcStack_38 + lVar3;
    pcStack_38[~(ulong)(pcStack_38[uVar6 - 2] == '\r') + uVar6] = '\0';
  }
  if (pcVar7 != (char *)0x0) {
    cVar2 = *pcStack_38;
    while( true ) {
      if (cVar2 == '\0') {
        return pcStack_38 == pcVar7;
      }
      pcVar4 = pcStack_38 + -1;
      sVar5 = 0;
      pcVar8 = pcStack_38;
      do {
        pcVar8 = pcVar8 + 1;
        pbVar1 = (byte *)(pcVar4 + 1);
        pcVar4 = pcVar4 + 1;
        sVar5 = sVar5 + 1;
        pcVar9 = pcVar4;
      } while ((*(ulong *)(kj::(anonymous_namespace)::HTTP_HEADER_NAME_CHARS +
                          (ulong)(*pbVar1 >> 6) * 8) >> ((ulong)*pbVar1 & 0x3f) & 1) != 0);
      for (; (cVar2 = *pcVar9, cVar2 == ' ' || (cVar2 == '\t')); pcVar9 = pcVar9 + 1) {
        pcVar8 = pcVar8 + 1;
      }
      if (cVar2 == ':' && sVar5 != 1) {
        for (; (*pcVar8 == ' ' || (*pcVar8 == '\t')); pcVar8 = pcVar8 + 1) {
        }
        *pcVar4 = '\0';
        unaff_R12 = pcStack_38;
        unaff_R13 = sVar5;
        pcStack_38 = pcVar8;
      }
      if (cVar2 != ':' || sVar5 == 1) break;
      value = consumeLine(&pcStack_38);
      name.content.size_ = unaff_R13;
      name.content.ptr = unaff_R12;
      addNoCheck(this,name,value);
      cVar2 = *pcStack_38;
    }
    return false;
  }
  return false;
}

Assistant:

static char* trimHeaderEnding(kj::ArrayPtr<char> content) {
  // Trim off the trailing \r\n from a header blob.

  if (content.size() < 2) return nullptr;

  // Remove trailing \r\n\r\n and replace with \0 sentinel char.
  char* end = content.end();

  if (end[-1] != '\n') return nullptr;
  --end;
  if (end[-1] == '\r') --end;
  *end = '\0';

  return end;
}